

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O1

string * __thiscall
ser::Savepoint::ToString_abi_cxx11_(string *__return_storage_ptr__,Savepoint *this)

{
  ostream *poVar1;
  ostringstream ss;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->name_)._M_dataplus._M_p,
                      (this->name_)._M_string_length);
  MetainfoSet::ToString_abi_cxx11_(&local_1b0,&this->metainfo_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Savepoint::ToString() const
{
    std::ostringstream ss;
    ss << name_ << metainfo_.ToString();
    return ss.str();
}